

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaintype.cpp
# Opt level: O0

optional<ChainType> ChainTypeFromString(string_view chain)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  bool bVar1;
  char *in_RSI;
  size_t in_RDI;
  long in_FS_OFFSET;
  ChainType *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  _Optional_payload_base<ChainType> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  __x._M_len._4_4_ = in_stack_ffffffffffffff44;
  __x._M_len._0_4_ = in_stack_ffffffffffffff40;
  __x._M_str = in_stack_ffffffffffffff48;
  __y._M_str = in_stack_ffffffffffffff38;
  __y._M_len = in_stack_ffffffffffffff30;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    std::optional<ChainType>::optional<ChainType,_true>
              ((optional<ChainType> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    __x_00._M_len._4_4_ = in_stack_ffffffffffffff44;
    __x_00._M_len._0_4_ = in_stack_ffffffffffffff40;
    __x_00._M_str = in_stack_ffffffffffffff48;
    __y_00._M_str = in_stack_ffffffffffffff38;
    __y_00._M_len = in_stack_ffffffffffffff30;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      std::optional<ChainType>::optional<ChainType,_true>
                ((optional<ChainType> *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff10);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      __x_01._M_len._4_4_ = in_stack_ffffffffffffff44;
      __x_01._M_len._0_4_ = in_stack_ffffffffffffff40;
      __x_01._M_str = in_stack_ffffffffffffff48;
      __y_01._M_str = in_stack_ffffffffffffff38;
      __y_01._M_len = in_stack_ffffffffffffff30;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        std::optional<ChainType>::optional<ChainType,_true>
                  ((optional<ChainType> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff10);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        __x_02._M_len._4_4_ = in_stack_ffffffffffffff44;
        __x_02._M_len._0_4_ = in_stack_ffffffffffffff40;
        __x_02._M_str = in_stack_ffffffffffffff48;
        __y_02._M_str = in_stack_ffffffffffffff38;
        __y_02._M_len = in_stack_ffffffffffffff30;
        bVar1 = std::operator==(__x_02,__y_02);
        if (bVar1) {
          std::optional<ChainType>::optional<ChainType,_true>
                    ((optional<ChainType> *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff10);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
          __x_03._M_len._4_4_ = in_stack_ffffffffffffff44;
          __x_03._M_len._0_4_ = in_stack_ffffffffffffff40;
          __x_03._M_str = in_stack_ffffffffffffff48;
          __y_03._M_str = in_RSI;
          __y_03._M_len = in_RDI;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            std::optional<ChainType>::optional<ChainType,_true>
                      ((optional<ChainType> *)CONCAT44(3,in_stack_ffffffffffffff18),
                       in_stack_ffffffffffffff10);
          }
          else {
            std::optional<ChainType>::optional((optional<ChainType> *)&local_10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<ChainType>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<ChainType> ChainTypeFromString(std::string_view chain)
{
    if (chain == "main") {
        return ChainType::MAIN;
    } else if (chain == "test") {
        return ChainType::TESTNET;
    } else if (chain == "testnet4") {
        return ChainType::TESTNET4;
    } else if (chain == "signet") {
        return ChainType::SIGNET;
    } else if (chain == "regtest") {
        return ChainType::REGTEST;
    } else {
        return std::nullopt;
    }
}